

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cymric.cpp
# Opt level: O0

int cymric_seed(cymric_rng *R,void *seed,int bytes)

{
  int iVar1;
  uint32_t uVar2;
  int iVar3;
  __pid_t _Var4;
  uint uVar5;
  uint64_t uVar6;
  time_t tVar7;
  int in_EDX;
  uint64_t in_RSI;
  uint64_t in_RDI;
  uint32_t *c0;
  uint32_t *t1;
  uint32_t *sr;
  uint64_t *s0;
  uint32_t *tid;
  uint32_t *pid;
  int min_bytes;
  int devrand_bytes;
  uint32_t *t0;
  blake2b_state state;
  uint8_t *scratch;
  uint8_t scratch_buff [48];
  int entropy;
  undefined4 in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd4c;
  uint8_t *in_stack_fffffffffffffd50;
  blake2b_state *in_stack_fffffffffffffd58;
  uint8_t outlen;
  blake2b_state *out;
  blake2b_state *pbVar8;
  uint8_t in_stack_fffffffffffffdff;
  void *in_stack_fffffffffffffe00;
  uint8_t in_stack_fffffffffffffe0f;
  blake2b_state *in_stack_fffffffffffffe10;
  undefined1 auStack_1e0 [312];
  blake2b_state *local_a8 [3];
  int local_70;
  int local_6c;
  uint64_t local_68;
  uint64_t local_60;
  int local_54;
  
  local_70 = 0;
  local_a8[0] = (blake2b_state *)&stack0xffffffffffffff70;
  if (in_RDI == 0) {
    local_54 = -1;
  }
  else if (m_is_initialized) {
    local_6c = in_EDX;
    local_68 = in_RSI;
    local_60 = in_RDI;
    iVar1 = blake2b_init_key(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0f,
                             in_stack_fffffffffffffe00,in_stack_fffffffffffffdff);
    if (iVar1 == 0) {
      if (((local_68 == 0) || (local_6c < 1)) ||
         (iVar1 = blake2b_update(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)),
         iVar1 == 0)) {
        pbVar8 = local_a8[0];
        uVar2 = GetCPUCycles();
        *(uint32_t *)pbVar8->h = uVar2;
        iVar1 = blake2b_update(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
        if (iVar1 == 0) {
          local_70 = local_70 + 0x20;
          iVar1 = read_file((char *)in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                            in_stack_fffffffffffffd4c);
          iVar3 = read_file((char *)in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                            in_stack_fffffffffffffd4c);
          if (iVar3 < 0x20 - iVar1) {
            local_54 = -6;
          }
          else {
            iVar1 = blake2b_update(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                                   CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
            pbVar8 = local_a8[0];
            if (iVar1 == 0) {
              local_70 = local_70 + 0x100;
              _Var4 = getpid();
              *(__pid_t *)pbVar8->h = _Var4;
              iVar1 = blake2b_update(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                                     CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
              pbVar8 = local_a8[0];
              if (iVar1 == 0) {
                local_70 = local_70 + 0x20;
                uVar2 = unix_gettid();
                *(uint32_t *)pbVar8->h = uVar2;
                iVar1 = blake2b_update(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                                       CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)
                                      );
                pbVar8 = local_a8[0];
                if (iVar1 == 0) {
                  local_70 = local_70 + 0x20;
                  uVar6 = GetMicrosecondTimeCounter();
                  pbVar8->h[0] = uVar6;
                  iVar1 = blake2b_update(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                                         CONCAT44(in_stack_fffffffffffffd4c,
                                                  in_stack_fffffffffffffd48));
                  if (iVar1 == 0) {
                    local_70 = local_70 + 0x20;
                    uVar5 = rand();
                    tVar7 = time((time_t *)0x0);
                    srand(uVar5 ^ (uint)tVar7);
                    pbVar8 = local_a8[0];
                    outlen = (uint8_t)(uVar5 >> 0x18);
                    iVar1 = rand();
                    *(int *)pbVar8->h = iVar1;
                    iVar1 = rand();
                    *(int *)((long)pbVar8->h + 4) = iVar1;
                    iVar1 = blake2b_update(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                                           CONCAT44(in_stack_fffffffffffffd4c,
                                                    in_stack_fffffffffffffd48));
                    if (iVar1 == 0) {
                      local_70 = local_70 + 0x28;
                      pbVar8 = local_a8[0];
                      uVar2 = GetCPUCycles();
                      *(uint32_t *)pbVar8->h = uVar2;
                      iVar1 = blake2b_update(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                                             CONCAT44(in_stack_fffffffffffffd4c,
                                                      in_stack_fffffffffffffd48));
                      if (iVar1 == 0) {
                        local_70 = local_70 + 9;
                        out = local_a8[0];
                        uVar2 = get_counter();
                        *(uint32_t *)out->h = uVar2;
                        iVar1 = blake2b_update(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                                               CONCAT44(in_stack_fffffffffffffd4c,
                                                        in_stack_fffffffffffffd48));
                        if (iVar1 == 0) {
                          local_70 = local_70 + 1;
                          iVar1 = blake2b_final(pbVar8,(uint8_t *)out,outlen);
                          if (iVar1 == 0) {
                            secure_zero_memory(auStack_1e0,0x100);
                            secure_zero_memory(local_a8,8);
                            if (local_70 < 0x1a9) {
                              local_54 = -0x18;
                            }
                            else {
                              *(undefined1 *)(local_60 + 0x40) = 0x53;
                              *(undefined1 *)(local_60 + 0x41) = 0x45;
                              *(undefined1 *)(local_60 + 0x42) = 0x45;
                              *(undefined1 *)(local_60 + 0x43) = 0x44;
                              local_54 = 0;
                            }
                          }
                          else {
                            local_54 = -0x17;
                          }
                        }
                        else {
                          local_54 = -0x16;
                        }
                      }
                      else {
                        local_54 = -0x15;
                      }
                    }
                    else {
                      local_54 = -0x14;
                    }
                  }
                  else {
                    local_54 = -0x12;
                  }
                }
                else {
                  local_54 = -0xf;
                }
              }
              else {
                local_54 = -0xe;
              }
            }
            else {
              local_54 = -7;
            }
          }
        }
        else {
          local_54 = -5;
        }
      }
      else {
        local_54 = -4;
      }
    }
    else {
      local_54 = -3;
    }
  }
  else {
    local_54 = -2;
  }
  return local_54;
}

Assistant:

int cymric_seed(
    cymric_rng* R,      ///< [out] Generator to seed
    const void* seed,   ///< [in] Seed bytes to use
    int bytes           ///< [in] Number of seed bytes
) {
    // Self-test, verified to fail if set too high
    static const int MIN_ENTROPY = 425;
    int entropy = 0;

    // Align scratch space to 16 bytes
    static const unsigned kAlignmentBytes = 16;

    // Scratch space for loading entropy source bits
    uint8_t scratch_buff[kAlignmentBytes + SEED_SCRATCH_BYTES];

    // Align scratch to avoid alignment issues on mobile
    uint8_t* scratch = scratch_buff;
    scratch += kAlignmentBytes - ((uintptr_t)scratch % kAlignmentBytes);

    // Initialize BLAKE2 state for 512-bit output
    blake2b_state state;

    // If input is invalid:
    if (!R)
        return -1;

    // If not initialized yet:
    if (!m_is_initialized)
        return -2;

    // Mix in previous or uninitialized state
    if (blake2b_init_key(&state, 64, R->internal, 64))
        return -3;

    // Mix in the seed
    if (seed && bytes > 0) {
        if (blake2b_update(&state, (const uint8_t *)seed, bytes))
            return -4;
    }

#ifdef CYMRIC_CYCLES
    {
        // Mix in initial cycle count
        uint32_t *t0 = (uint32_t *)scratch;
        *t0 = GetCPUCycles();
        if (blake2b_update(&state, scratch, 4))
            return -5;
        entropy += 32;
    }
#endif

#ifdef CYMRIC_DEV_RANDOM
    {
        // Mix in /dev/random.
        // This is a bit of a hack.  Most Linuxy systems "cache" about 20 bytes
        // for /dev/random.  Requesting 32 bytes may take up to a minute longer
        // and this would be really irritating for users of the library.  So
        // instead we grab just 20 bytes and then take the rest from urandom,
        // which is often implemented as a separate pool that will actually
        // provide additional entropy over /dev/random even when that device
        // is blocking waiting for more
        int devrand_bytes = read_file(CYMRIC_RAND_FILE, scratch, 20);

        // Fill in the rest with /dev/urandom
        int min_bytes = 32 - devrand_bytes;
        if (read_file(CYMRIC_URAND_FILE, scratch + devrand_bytes, min_bytes) < min_bytes)
            return -6;

        if (blake2b_update(&state, scratch, 32))
            return -7;
        entropy += 256;
    }
#endif

#ifdef CYMRIC_WINCRYPT
    {
        // Mix in Windows cryptographic RNG
        HCRYPTPROV hCryptProv;
        if (!CryptAcquireContext(&hCryptProv, 0, 0, PROV_RSA_FULL, CRYPT_VERIFYCONTEXT|CRYPT_SILENT))
            return -8;
        if (hCryptProv && !CryptGenRandom(hCryptProv, 32, scratch))
            return -9;
        if (hCryptProv && !CryptReleaseContext(hCryptProv, 0))
            return -10;
        if (blake2b_update(&state, scratch, 32))
            return -11;
        entropy += 256;
    }
#endif

#ifdef CYMRIC_ARC4RANDOM
    {
        // Mix in arc4random
        arc4random_buf(scratch, 32);
        if (blake2b_update(&state, scratch, 32))
            return -12;
        entropy += 256;
    }
#endif
    
#ifdef CYMRIC_WINMEM
    {
        // Mix in Windows memory info
        MEMORYSTATUS *mem_stats = (MEMORYSTATUS *)scratch;
        GlobalMemoryStatus(mem_stats);
        if (blake2b_update(&state, scratch, sizeof(MEMORYSTATUS)))
            return -13;
        entropy += 32;
    }
#endif

#ifdef CYMRIC_GETPID
    {
        // Mix in process id
        uint32_t *pid = (uint32_t *)scratch;
        *pid = (uint32_t)getpid();
        if (blake2b_update(&state, scratch, 4))
            return -14;
        entropy += 32;
    }
#endif

#ifdef CYMRIC_GETTID
    {
        // Mix in thread id
        uint32_t *tid = (uint32_t *)scratch;
        *tid = unix_gettid();
        if (blake2b_update(&state, scratch, 4))
            return -15;
        entropy += 32;
    }
#endif

#ifdef CYMRIC_PTHREADS
    {
        // Mix in pthread self id
        pthread_t *myself = (pthread_t *)scratch;
        *myself = pthread_self();
        if (blake2b_update(&state, scratch, sizeof(pthread_t)))
            return -16;
        entropy += 32;
    }
#endif

#ifdef CYMRIC_WINTID
    {
        // Mix in thread id
        uint32_t *wintid = (uint32_t *)scratch;
        *wintid = GetCurrentThreadId();
        if (blake2b_update(&state, scratch, 4))
            return -17;
        entropy += 32;
    }
#endif

#ifdef CYMRIC_USEC
    {
        // Mix in microsecond clock
        uint64_t *s0 = (uint64_t *)scratch;
        *s0 = GetMicrosecondTimeCounter();
        if (blake2b_update(&state, scratch, sizeof(double)))
            return -18;
        entropy += 32;
    }
#endif

#ifdef CYMRIC_SRANDOM
    {
        // Mix in srandom
        srandom(random() ^ time(0));
        uint32_t *sr = (uint32_t *)scratch;
        sr[0] = random();
        sr[1] = random();
        if (black2b_update(&state, scratch, 8))
            return -19;
        entropy += 40;
    }
#endif

#ifdef CYMRIC_SRAND
    {
        // Mix in srand
        srand(rand() ^ (unsigned int)time(0));
        uint32_t *sr = (uint32_t *)scratch;
        sr[0] = rand();
        sr[1] = rand();
        if (blake2b_update(&state, scratch, 8))
            return -20;
        entropy += 40;
    }
#endif

#ifdef CYMRIC_CYCLES
    {
        // Mix in final cycle count
        uint32_t *t1 = (uint32_t *)scratch;
        *t1 = GetCPUCycles();
        if (blake2b_update(&state, scratch, 4))
            return -21;
        entropy += 9;
    }
#endif

#ifdef CYMRIC_COUNTER
    {
        // Mix in incrementing counter
        uint32_t *c0 = (uint32_t *)scratch;
        *c0 = get_counter();
        if (blake2b_update(&state, scratch, 4))
            return -22;
        entropy += 1;
    }
#endif

    // Squeeze out 512 random bits from entropy sources
    if (blake2b_final(&state, (uint8_t *)R->internal, 64))
        return -23;

    // Erase BLAKE2 state and scratch
    CAT_SECURE_OBJCLR(state.buf);
    CAT_SECURE_OBJCLR(scratch);

    // Sanity check for compilation
    if (entropy < MIN_ENTROPY)
        return -24;

    // Indicate state is seeded
    R->internal[64] = 'S';
    R->internal[65] = 'E';
    R->internal[66] = 'E';
    R->internal[67] = 'D';

    return 0;
}